

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O1

ostream * std::operator<<(ostream *os,
                         vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *v)

{
  pointer phVar1;
  ulong uVar2;
  float fVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  phVar1 = (v->super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((v->super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>)._M_impl
      .super__Vector_impl_data._M_finish != phVar1) {
    uVar2 = 0;
    do {
      fVar3 = tinyusdz::value::half_to_float((half)phVar1[uVar2].value);
      std::ostream::_M_insert<double>((double)fVar3);
      if (uVar2 != ((long)(v->
                          super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(v->
                          super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 1) - 1U) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      }
      uVar2 = uVar2 + 1;
      phVar1 = (v->super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(v->
                                   super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)phVar1 >> 1))
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const std::vector<T> &v) {
  os << "[";
  for (size_t i = 0; i < v.size(); i++) {
    os << v[i];
    if (i != (v.size() - 1)) {
      os << ", ";
    }
  }
  os << "]";
  return os;
}